

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsChaseCamera.cpp
# Opt level: O2

void __thiscall chrono::utils::ChChaseCamera::Zoom(ChChaseCamera *this,int val)

{
  State SVar1;
  double dVar2;
  
  if (val == 0) {
    return;
  }
  SVar1 = this->m_state;
  if (Follow < SVar1) {
    if (SVar1 == Track) {
      return;
    }
    if (SVar1 == Inside) {
      if (val < 1) {
        return;
      }
      SetState(this,Chase);
      return;
    }
    goto LAB_00e3f7bb;
  }
  dVar2 = this->m_mult;
  if (val < 0) {
    if (this->m_minMult < dVar2) {
      dVar2 = dVar2 / 1.01;
      goto LAB_00e3f798;
    }
  }
  else if (dVar2 < this->m_maxMult) {
    dVar2 = dVar2 * 1.01;
LAB_00e3f798:
    this->m_mult = dVar2;
  }
  if (this->m_minMult < dVar2) {
    return;
  }
  SetState(this,Inside);
  SVar1 = this->m_state;
LAB_00e3f7bb:
  if (SVar1 == Free) {
    if (val < 0) {
      dVar2 = this->m_mult + 0.01;
    }
    else {
      dVar2 = this->m_mult + -0.01;
    }
    this->m_mult = dVar2;
  }
  return;
}

Assistant:

void ChChaseCamera::Zoom(int val) {
    if (val == 0 || m_state == Track)
        return;

    if (m_state == Inside) {
        if (val > 0)
            SetState(Chase);
        return;
    }
        
    if (m_state == Chase || m_state == Follow) {
        if (val < 0 && m_mult > m_minMult)
            m_mult /= 1.01;
        else if (val > 0 && m_mult < m_maxMult)
            m_mult *= 1.01;

        if (m_mult <= m_minMult)
            SetState(Inside);
    }

    if (m_state == Free) {
        if (val < 0)
            m_mult += 0.01;
        else
            m_mult -= 0.01;
    }

}